

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O0

void duckdb::BakeTableName(ParsedExpression *expr,BindingAlias *binding_alias)

{
  ExpressionType EVar1;
  const_iterator __position;
  ulong uVar2;
  BindingAlias *in_RSI;
  BaseExpression *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *col_names;
  ColumnRefExpression *colref;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff38;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff40;
  function<void_(duckdb::ParsedExpression_&)> *in_stack_ffffffffffffff48;
  function<void_(duckdb::ParsedExpression_&)> *this;
  function<void_(duckdb::ParsedExpression_&)> *in_stack_ffffffffffffff50;
  function<void_(duckdb::ParsedExpression_&)> *pfVar3;
  function<void_(duckdb::ParsedExpression_&)> *in_stack_ffffffffffffff78;
  BindingAlias *in_stack_ffffffffffffff80;
  value_type *in_stack_ffffffffffffffd8;
  
  EVar1 = BaseExpression::GetExpressionType(in_RDI);
  if (EVar1 == COLUMN_REF) {
    __position._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         BaseExpression::Cast<duckdb::ColumnRefExpression>
                   ((BaseExpression *)in_stack_ffffffffffffff80);
    pfVar3 = (function<void_(duckdb::ParsedExpression_&)> *)
             &((ColumnRefExpression *)__position._M_current)->column_names;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin(in_stack_ffffffffffffff38);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              (in_stack_ffffffffffffff40,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffff38);
    BindingAlias::GetAlias_abi_cxx11_(in_stack_ffffffffffffff80);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)pfVar3,__position,in_stack_ffffffffffffffd8);
    BindingAlias::GetSchema_abi_cxx11_(in_RSI);
    uVar2 = ::std::__cxx11::string::empty();
    this = pfVar3;
    if ((uVar2 & 1) == 0) {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin(in_stack_ffffffffffffff38);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                (in_stack_ffffffffffffff40,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffff38);
      BindingAlias::GetSchema_abi_cxx11_(in_RSI);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this,__position,in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffff50 = pfVar3;
    }
    BindingAlias::GetCatalog_abi_cxx11_(in_RSI);
    uVar2 = ::std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      pfVar3 = this;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin(in_stack_ffffffffffffff38);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                (in_stack_ffffffffffffff40,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffff38);
      BindingAlias::GetCatalog_abi_cxx11_(in_RSI);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)pfVar3,__position,in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffff48 = this;
    }
  }
  ::std::function<void(duckdb::ParsedExpression&)>::
  function<duckdb::BakeTableName(duckdb::ParsedExpression&,duckdb::BindingAlias_const&)::__0,void>
            (in_stack_ffffffffffffff50,(anon_class_8_1_31144e36 *)in_stack_ffffffffffffff48);
  ParsedExpressionIterator::EnumerateChildren
            ((ParsedExpression *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  ::std::function<void_(duckdb::ParsedExpression_&)>::~function
            ((function<void_(duckdb::ParsedExpression_&)> *)0xe722a1);
  return;
}

Assistant:

static void BakeTableName(ParsedExpression &expr, const BindingAlias &binding_alias) {
	if (expr.GetExpressionType() == ExpressionType::COLUMN_REF) {
		auto &colref = expr.Cast<ColumnRefExpression>();
		D_ASSERT(!colref.IsQualified());
		auto &col_names = colref.column_names;
		col_names.insert(col_names.begin(), binding_alias.GetAlias());
		if (!binding_alias.GetSchema().empty()) {
			col_names.insert(col_names.begin(), binding_alias.GetSchema());
		}
		if (!binding_alias.GetCatalog().empty()) {
			col_names.insert(col_names.begin(), binding_alias.GetCatalog());
		}
	}
	ParsedExpressionIterator::EnumerateChildren(expr,
	                                            [&](ParsedExpression &child) { BakeTableName(child, binding_alias); });
}